

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo,_kj::_::PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>_>
::reject(AdapterPromiseNode<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo,_kj::_::PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>_>
         *this,Exception *exception)

{
  ExceptionOr<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo> local_190;
  
  if (this->waiting == true) {
    this->waiting = false;
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_190,exception);
    local_190.value.ptr.isSet = false;
    ExceptionOr<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>::operator=
              (&this->result,&local_190);
    ExceptionOr<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>::~ExceptionOr
              (&local_190);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }